

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * __thiscall QString::replace(QString *this,qsizetype pos,qsizetype len,QChar after)

{
  ulong uVar1;
  long lVar2;
  long in_FS_OFFSET;
  QSpan<unsigned_long,_18446744073709551615UL> indices;
  QStringView after_00;
  size_t index;
  char16_t local_1a;
  unsigned_long local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->d).size;
  lVar2 = uVar1 - pos;
  local_1a = after.ucs;
  if ((ulong)pos <= uVar1) {
    if (lVar2 < len) {
      len = lVar2;
    }
    indices.super_QSpanBase<unsigned_long,_18446744073709551615UL>.m_size = 1;
    indices.super_QSpanBase<unsigned_long,_18446744073709551615UL>.m_data = &local_18;
    after_00.m_data = &local_1a;
    after_00.m_size = 1;
    local_18 = pos;
    replace_helper(this,indices,len,after_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::replace(qsizetype pos, qsizetype len, QChar after)
{
    return replace(pos, len, &after, 1);
}